

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O1

void __thiscall Timidity::Renderer::~Renderer(Renderer *this)

{
  if (this->resample_buffer != (sample_t *)0x0) {
    M_Free(this->resample_buffer);
  }
  if (this->voice != (Voice *)0x0) {
    operator_delete__(this->voice);
  }
  if (this->patches != (DLS_Data *)0x0) {
    FreeDLS(this->patches);
  }
  return;
}

Assistant:

Renderer::~Renderer()
{
	if (resample_buffer != NULL)
	{
		M_Free(resample_buffer);
	}
	if (voice != NULL)
	{
		delete[] voice;
	}
	if (patches != NULL)
	{
		FreeDLS(patches);
	}
}